

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeadReckoningParameter.h
# Opt level: O2

void __thiscall
KDIS::PDU::Entity_State_PDU::SetDeadReckoningParameter
          (Entity_State_PDU *this,DeadReckoningParameter *DRP)

{
  undefined8 uVar1;
  KOCTET KVar2;
  KOCTET KVar3;
  KOCTET KVar4;
  KOCTET KVar5;
  KOCTET KVar6;
  KOCTET KVar7;
  KOCTET KVar8;
  KFLOAT32 KVar9;
  
  KVar2 = DRP->m_OtherParams[0];
  KVar3 = DRP->m_OtherParams[1];
  KVar4 = DRP->m_OtherParams[2];
  KVar5 = DRP->m_OtherParams[3];
  KVar6 = DRP->m_OtherParams[4];
  KVar7 = DRP->m_OtherParams[5];
  KVar8 = DRP->m_OtherParams[6];
  uVar1 = *(undefined8 *)(DRP->m_OtherParams + 7);
  (this->m_DeadReckoningParameter).m_ui8DeadRecknoningAlgorithm = DRP->m_ui8DeadRecknoningAlgorithm;
  (this->m_DeadReckoningParameter).m_OtherParams[0] = KVar2;
  (this->m_DeadReckoningParameter).m_OtherParams[1] = KVar3;
  (this->m_DeadReckoningParameter).m_OtherParams[2] = KVar4;
  (this->m_DeadReckoningParameter).m_OtherParams[3] = KVar5;
  (this->m_DeadReckoningParameter).m_OtherParams[4] = KVar6;
  (this->m_DeadReckoningParameter).m_OtherParams[5] = KVar7;
  (this->m_DeadReckoningParameter).m_OtherParams[6] = KVar8;
  *(undefined8 *)((this->m_DeadReckoningParameter).m_OtherParams + 7) = uVar1;
  KVar9 = (DRP->m_LinearAcceleration).m_f32Y;
  (this->m_DeadReckoningParameter).m_LinearAcceleration.m_f32X = (DRP->m_LinearAcceleration).m_f32X;
  (this->m_DeadReckoningParameter).m_LinearAcceleration.m_f32Y = KVar9;
  (this->m_DeadReckoningParameter).m_LinearAcceleration.m_f32Z = (DRP->m_LinearAcceleration).m_f32Z;
  KVar9 = (DRP->m_AngularVelocity).m_f32Y;
  (this->m_DeadReckoningParameter).m_AngularVelocity.m_f32X = (DRP->m_AngularVelocity).m_f32X;
  (this->m_DeadReckoningParameter).m_AngularVelocity.m_f32Y = KVar9;
  (this->m_DeadReckoningParameter).m_AngularVelocity.m_f32Z = (DRP->m_AngularVelocity).m_f32Z;
  return;
}

Assistant:

class KDIS_EXPORT DeadReckoningParameter : public DataTypeBase
{
protected:

    KUINT8 m_ui8DeadRecknoningAlgorithm;

    KOCTET m_OtherParams[15]; // Undefined

    Vector m_LinearAcceleration;

    Vector m_AngularVelocity;

public:

    static const KUINT16 DEAD_RECKONING_PARAMETER_SIZE = 40;

    DeadReckoningParameter();

    explicit DeadReckoningParameter(KDataStream &stream) noexcept(false);

    DeadReckoningParameter( KDIS::DATA_TYPE::ENUMS::DeadReckoningAlgorithm DRA, const Vector & LinearAcceleration,
                            const Vector & AngularVelocity );

    ~DeadReckoningParameter() override = default;

    //************************************
    // FullName:    KDIS::DATA_TYPE::DeadReckoningParameter::SetDeadReckoningAlgorithm
    //              KDIS::DATA_TYPE::DeadReckoningParameter::GetDeadReckoningAlgorithm
    // Description: Dead Reckoning Algorithm
    // Parameter:   DeadReckoningAlgorithm DRA
    //************************************
    void SetDeadReckoningAlgorithm( KDIS::DATA_TYPE::ENUMS::DeadReckoningAlgorithm DRA );
    KDIS::DATA_TYPE::ENUMS::DeadReckoningAlgorithm GetDeadReckoningAlgorithm() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::DeadReckoningParameter::SetLinearAcceleration
    //              KDIS::DATA_TYPE::DeadReckoningParameter::GetLinearAcceleration
    // Description: Linear Acceleration in m/s.
    // Parameter:   const Vector & LA
    //************************************
    void SetLinearAcceleration( const Vector & LA );
    const Vector & GetLinearAcceleration() const;
    Vector & GetLinearAcceleration();

    //************************************
    // FullName:    KDIS::DATA_TYPE::DeadReckoningParameter::SetAngularVelocity
    //              KDIS::DATA_TYPE::DeadReckoningParameter::GetAngularVelocity
    // Description: Angular Velocity
    // Parameter:   const EulerAngles & AV
    //************************************
    void SetAngularVelocity( const Vector & AV );
    const Vector & GetAngularVelocity() const;
    Vector & GetAngularVelocity();

    //************************************
    // FullName:    KDIS::DATA_TYPE::DeadReckoningParameter::SetQuatAxis
    //              KDIS::DATA_TYPE::DeadReckoningParameter::GetQuatAxis
    // Description: Updated DIS - Geometric Interpretation of Orientation Dead Reckoning / Quaternion axis
    // Parameter:   const EulerAngles & AV
    //************************************
    void SetQuatAxis( const Vector & QA );
    const Vector GetQuatAxis() const;
    Vector GetQuatAxis();

    //************************************
    // FullName:    KDIS::DATA_TYPE::DeadReckoningParameter::GetAsString
    // Description: Returns a string representation
    //************************************
    KString GetAsString() const override;

    //************************************
    // FullName:    KDIS::DATA_TYPE::DeadReckoningParameter::Decode
    // Description: Convert From Network Data.
    // Parameter:   KDataStream & stream
    //************************************
    void Decode(KDataStream &stream) noexcept(false) override;

    //************************************
    // FullName:    KDIS::DATA_TYPE::DeadReckoningParameter::Encode
    // Description: Convert To Network Data.
    // Parameter:   KDataStream & stream
    //************************************
    KDataStream Encode() const override;

    void Encode(KDataStream &stream) const override;

    KBOOL operator == ( const DeadReckoningParameter & Value ) const;
    KBOOL operator != ( const DeadReckoningParameter & Value ) const;
}